

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O1

void JS_FreeCString(JSContext *ctx,char *ptr)

{
  int iVar1;
  JSRuntime *pJVar2;
  uint uVar3;
  uint32_t *puVar4;
  JSAtomStruct *pJVar5;
  JSAtomStruct *pJVar6;
  JSAtomStruct *pJVar7;
  ulong uVar8;
  
  if ((ptr != (char *)0x0) &&
     (iVar1 = *(int *)(ptr + -0x10), *(int *)(ptr + -0x10) = iVar1 + -1, iVar1 < 2)) {
    pJVar2 = ctx->rt;
    pJVar7 = (JSAtomStruct *)(ptr + -0x10);
    if (*(ulong *)(ptr + -0xc) >> 0x3e == 0) {
      (*(pJVar2->mf).js_free)(&pJVar2->malloc_state,pJVar7);
      return;
    }
    uVar3 = (uint)((ulong)*(undefined8 *)(ptr + -0xc) >> 0x20);
    if (uVar3 >> 0x1e < 3) {
      uVar8 = (ulong)((pJVar2->atom_hash_size - 1U & uVar3) << 2);
      uVar3 = *(uint *)((long)pJVar2->atom_hash + uVar8);
      pJVar6 = pJVar2->atom_array[uVar3];
      if (pJVar6 == pJVar7) {
        puVar4 = (uint32_t *)((long)pJVar2->atom_hash + uVar8);
      }
      else {
        do {
          pJVar5 = pJVar6;
          uVar3 = pJVar5->hash_next;
          pJVar6 = pJVar2->atom_array[uVar3];
        } while (pJVar6 != pJVar7);
        puVar4 = &pJVar5->hash_next;
      }
      *puVar4 = pJVar6->hash_next;
    }
    else {
      uVar3 = *(uint *)(ptr + -4);
    }
    pJVar2->atom_array[uVar3] = (JSAtomStruct *)((ulong)(uint)pJVar2->atom_free_index * 2 + 1);
    pJVar2->atom_free_index = uVar3;
    (*(pJVar2->mf).js_free)(&pJVar2->malloc_state,pJVar7);
    pJVar2->atom_count = pJVar2->atom_count + -1;
    return;
  }
  return;
}

Assistant:

void JS_FreeCString(JSContext *ctx, const char *ptr)
{
    JSString *p;
    if (!ptr)
        return;
    /* purposely removing constness */
    p = (JSString *)(void *)(ptr - offsetof(JSString, u));
    JS_FreeValue(ctx, JS_MKPTR(JS_TAG_STRING, p));
}